

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

uint64_t buffer_scroll(buffer_t *buffer,uint64_t offset,int width,int height)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = offset / (ulong)(long)width - ((ulong)(long)(height + -2) >> 1);
  if ((long)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar1 = (buffer->size / (ulong)(long)width - (long)height) + 3;
  if (uVar2 < uVar1) {
    uVar1 = uVar2;
  }
  uVar2 = buffer->size - 1;
  if (offset <= uVar2) {
    uVar2 = offset;
  }
  buffer->cursor = uVar2;
  return uVar1;
}

Assistant:

uint64_t
buffer_scroll(buffer_t *buffer, uint64_t offset, int width, int height)
{
    uint64_t rows = height - 2;
    uint64_t middle = rows / 2;

    uint64_t start = offset - (offset % width);
    int64_t scroll = start / width - middle;

    if (scroll < 0) {
        scroll = 0;
    }

    if (scroll > buffer->size / width - height + 3) {
        scroll = buffer->size / width - height + 3;
    }

    if (offset > buffer->size - 1) {
        offset = buffer->size - 1;
    }

    buffer->cursor = offset;
    return scroll;
}